

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

llb_buildsystem_command_t *
llb_buildsystem_external_command_create
          (llb_data_t *name,llb_buildsystem_external_command_delegate_t delegate)

{
  code *pcVar1;
  AlignedCharArrayUnion<llbuild::buildsystem::BuildValue,_char,_char,_char,_char,_char,_char,_char,_char,_char>
  *pAVar2;
  ExternalCommand *this;
  long lVar3;
  llb_buildsystem_external_command_delegate_t *plVar4;
  ExternalCommand *pEVar5;
  byte bVar6;
  StringRef SVar7;
  
  bVar6 = 0;
  if (delegate.start ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t
       *)0x0) {
    __assert_fail("delegate.start",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x52e,
                  "llb_buildsystem_command_t *llb_buildsystem_external_command_create(const llb_data_t *, llb_buildsystem_external_command_delegate_t)"
                 );
  }
  if (delegate.provide_value !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_build_value_ptr_uintptr_t
       *)0x0) {
    if (delegate.execute_command_detached !=
        (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
         *)0x0 || delegate.execute_command !=
                  (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
                   *)0x0) {
      this = (ExternalCommand *)operator_new(0x238);
      SVar7.Length = name->length;
      SVar7.Data = (char *)name->data;
      llbuild::buildsystem::ExternalCommand::Command(this,SVar7);
      (this->super_Command).super_JobDescriptor._vptr_JobDescriptor =
           (_func_int **)&PTR__CAPIExternalCommand_0022c120;
      plVar4 = &delegate;
      pEVar5 = this + 1;
      for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
        (pEVar5->super_Command).super_JobDescriptor._vptr_JobDescriptor =
             (_func_int **)plVar4->context;
        plVar4 = (llb_buildsystem_external_command_delegate_t *)
                 ((long)plVar4 + (ulong)bVar6 * -0x10 + 8);
        pEVar5 = (ExternalCommand *)((long)pEVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      this[1].description._M_dataplus._M_p = (pointer)&this[1].description.field_2;
      this[1].description._M_string_length = 0x100000000;
      *(char **)(this[1].skipValue.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 8) =
           this[1].skipValue.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 0x18;
      pAVar2 = &this[1].skipValue.Storage.storage;
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x10] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x11] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x12] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x13] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x14] = '\x01';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x15] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x16] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x17] = '\0';
      *(char **)(this[1].skipValue.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 0x38)
           = this[1].skipValue.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 0x48;
      pAVar2 = &this[1].skipValue.Storage.storage;
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x40] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x41] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x42] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x43] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x44] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x45] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x46] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x47] = '\0';
      this[1].skipValue.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0x48] = '\0';
      pAVar2 = &this[1].skipValue.Storage.storage;
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x58] = '\x02';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x59] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x5a] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x5b] = '\0';
      pAVar2 = &this[1].skipValue.Storage.storage;
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x60] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x61] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x62] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[99] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[100] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x65] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x66] = '\0';
      (pAVar2->super_AlignedCharArray<8UL,_112UL>).buffer[0x67] = '\0';
      this[1].skipValue.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0x68] = '\0';
      *(undefined8 *)&this[1].skipValue.Storage.hasVal = 0;
      pcVar1 = (code *)this[1].super_Command.name._M_dataplus._M_p;
      if (pcVar1 != (code *)0x0) {
        (*pcVar1)(this[1].super_Command.super_JobDescriptor._vptr_JobDescriptor,this,
                  anon_unknown.dwarf_214010::CAPIExternalCommand::CAPIExternalCommand::
                  anon_class_1_0_00000001::__invoke,
                  anon_unknown.dwarf_214010::CAPIExternalCommand::CAPIExternalCommand::
                  anon_class_1_0_00000001::__invoke,
                  anon_unknown.dwarf_214010::CAPIExternalCommand::CAPIExternalCommand::
                  anon_class_1_0_00000001::__invoke);
      }
      return (llb_buildsystem_command_t *)this;
    }
    __assert_fail("delegate.execute_command || delegate.execute_command_detached",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x530,
                  "llb_buildsystem_command_t *llb_buildsystem_external_command_create(const llb_data_t *, llb_buildsystem_external_command_delegate_t)"
                 );
  }
  __assert_fail("delegate.provide_value",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0x52f,
                "llb_buildsystem_command_t *llb_buildsystem_external_command_create(const llb_data_t *, llb_buildsystem_external_command_delegate_t)"
               );
}

Assistant:

llb_buildsystem_command_t*
llb_buildsystem_external_command_create(
    const llb_data_t* name,
    llb_buildsystem_external_command_delegate_t delegate) {
  // Check that all required methods are provided.
  assert(delegate.start);
  assert(delegate.provide_value);
  assert(delegate.execute_command || delegate.execute_command_detached);
  
  return (llb_buildsystem_command_t*) new CAPIExternalCommand(
      StringRef((const char*)name->data, name->length), delegate);
}